

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internalJSONNode.h
# Opt level: O2

void __thiscall internalJSONNode::internalJSONNode(internalJSONNode *this,char mytype)

{
  jsonChildren *pjVar1;
  
  this->_type = mytype;
  (this->_name)._M_dataplus._M_p = (pointer)&(this->_name).field_2;
  (this->_name)._M_string_length = 0;
  pjVar1 = (jsonChildren *)0x0;
  (this->_name).field_2._M_local_buf[0] = '\0';
  this->_name_encoded = false;
  (this->_string)._M_dataplus._M_p = (pointer)&(this->_string).field_2;
  (this->_string)._M_string_length = 0;
  (this->_string).field_2._M_local_buf[0] = '\0';
  this->_string_encoded = false;
  (this->_value)._number = 0.0;
  this->refcount = 1;
  this->fetched = true;
  if ((mytype & 0xfeU) == 4) {
    pjVar1 = jsonChildren::newChildren();
  }
  this->Children = pjVar1;
  return;
}

Assistant:

inline internalJSONNode::internalJSONNode(char mytype) json_nothrow : _type(mytype), _name(), _name_encoded(), _string(), _string_encoded(), _value()
    initializeMutex(0)
    initializeRefCount(1)
    initializeFetch(true)
    initializeComment(json_global(EMPTY_JSON_STRING))
    initializeChildren((_type == JSON_NODE || _type == JSON_ARRAY) ? jsonChildren::newChildren() : 0){

    LIBJSON_CTOR;

    #ifdef JSON_LESS_MEMORY
	   //if not less memory, its in the initialization list
	   if (isContainer()){
		  CHILDREN = jsonChildren::newChildren();
	   }
    #endif
}